

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O1

void __thiscall
ProtocolIPv4::ProtocolIPv4
          (ProtocolIPv4 *this,InterfaceMAC *mac,ProtocolARP *arp,ProtocolICMP *icmp,ProtocolTCP *tcp
          ,ProtocolUDP *udp)

{
  this->PacketID = 0;
  osQueue::osQueue(&this->UnresolvedQueue,"IP",0x14,this->TxBuffer);
  (this->Address).DataValid = false;
  (this->Address).Address[0] = '\0';
  (this->Address).Address[1] = '\0';
  (this->Address).Address[2] = '\0';
  (this->Address).Address[3] = '\0';
  *(undefined3 *)&(this->Address).field_0x5 = 0;
  (this->Address).IpAddressLeaseTime = 0;
  (this->Address).RenewTime = 0;
  (this->Address).RebindTime = 0;
  (this->Address).SubnetMask[0] = '\0';
  (this->Address).SubnetMask[1] = '\0';
  (this->Address).SubnetMask[2] = '\0';
  (this->Address).SubnetMask[3] = '\0';
  (this->Address).Gateway[0] = '\0';
  (this->Address).Gateway[1] = '\0';
  (this->Address).Gateway[2] = '\0';
  (this->Address).Gateway[3] = '\0';
  (this->Address).DomainNameServer[0] = '\0';
  (this->Address).DomainNameServer[1] = '\0';
  (this->Address).DomainNameServer[2] = '\0';
  (this->Address).DomainNameServer[3] = '\0';
  (this->Address).BroadcastAddress[0] = '\0';
  (this->Address).BroadcastAddress[1] = '\0';
  (this->Address).BroadcastAddress[2] = '\0';
  (this->Address).BroadcastAddress[3] = '\0';
  this->MAC = mac;
  this->ARP = arp;
  this->ICMP = icmp;
  this->TCP = tcp;
  this->UDP = udp;
  (this->Address).DataValid = false;
  return;
}

Assistant:

ProtocolIPv4::ProtocolIPv4(
    InterfaceMAC& mac, ProtocolARP& arp, ProtocolICMP& icmp, ProtocolTCP& tcp, ProtocolUDP& udp)
    : PacketID(0)
    , UnresolvedQueue("IP", TX_BUFFER_COUNT, TxBuffer)
    , Address()
    , MAC(mac)
    , ARP(arp)
    , ICMP(icmp)
    , TCP(tcp)
    , UDP(udp)
{
    Address.DataValid = false;
}